

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

shared_ptr<kratos::Var> __thiscall
pybind11::detail::try_get_shared_from_this<kratos::Var>
          (detail *this,enable_shared_from_this<kratos::Var> *holder_value_ptr)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::Var> sVar1;
  enable_shared_from_this<kratos::Var> local_28;
  enable_shared_from_this<kratos::Var> *local_18;
  enable_shared_from_this<kratos::Var> *holder_value_ptr_local;
  
  local_18 = holder_value_ptr;
  holder_value_ptr_local = (enable_shared_from_this<kratos::Var> *)this;
  std::enable_shared_from_this<kratos::Var>::weak_from_this(&local_28);
  std::weak_ptr<kratos::Var>::lock((weak_ptr<kratos::Var> *)this);
  std::weak_ptr<kratos::Var>::~weak_ptr(&local_28._M_weak_this);
  sVar1.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Var>)sVar1.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline static std::shared_ptr<T> try_get_shared_from_this(std::enable_shared_from_this<T> *holder_value_ptr) {
// Pre C++17, this code path exploits undefined behavior, but is known to work on many platforms.
// Use at your own risk!
// See also https://en.cppreference.com/w/cpp/memory/enable_shared_from_this, and in particular
// the `std::shared_ptr<Good> gp1 = not_so_good.getptr();` and `try`-`catch` parts of the example.
#if defined(__cpp_lib_enable_shared_from_this) && (!defined(_MSC_VER) || _MSC_VER >= 1912)
    return holder_value_ptr->weak_from_this().lock();
#else
    try {
        return holder_value_ptr->shared_from_this();
    }
    catch (const std::bad_weak_ptr &) {
        return nullptr;
    }
#endif
}